

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_affinity.h
# Opt level: O2

void __thiscall hierarchy_info::deriveLevels(hierarchy_info *this,AddrUnsPair *adr2os,int num_addrs)

{
  kmp_uint32 *pkVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint *puVar5;
  int iVar6;
  long lVar7;
  
  uVar2 = (ulong)(adr2os->first).depth;
  uVar3 = 0;
  uVar4 = (ulong)(uint)num_addrs;
  if (num_addrs < 1) {
    uVar4 = uVar3;
  }
  pkVar1 = this->numPerLevel;
  puVar5 = (adr2os->first).labels + uVar2 + 0x1f;
  while (0 < (int)uVar2) {
    uVar2 = uVar2 - 1;
    iVar6 = -1;
    for (lVar7 = 0; uVar4 * 0x10c - lVar7 != 0; lVar7 = lVar7 + 0x10c) {
      if (iVar6 < *(int *)((long)puVar5 + lVar7)) {
        iVar6 = *(int *)((long)puVar5 + lVar7);
      }
    }
    pkVar1[uVar3] = iVar6 + 1;
    uVar3 = uVar3 + 1;
    puVar5 = puVar5 + -1;
  }
  return;
}

Assistant:

void deriveLevels(AddrUnsPair *adr2os, int num_addrs) {
    int hier_depth = adr2os[0].first.depth;
    int level = 0;
    for (int i = hier_depth - 1; i >= 0; --i) {
      int max = -1;
      for (int j = 0; j < num_addrs; ++j) {
        int next = adr2os[j].first.childNums[i];
        if (next > max)
          max = next;
      }
      numPerLevel[level] = max + 1;
      ++level;
    }
  }